

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx_impl.c
# Opt level: O0

memory_allocator_impl memory_allocator_nginx_create(void *ctx)

{
  undefined8 *in_RDI;
  memory_allocator_nginx_impl nginx_impl;
  memory_allocator_nginx_ctx nginx_ctx;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)(*(code *)in_RDI[1])(*in_RDI,0x20);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    *local_8 = *in_RDI;
    local_8[1] = in_RDI[1];
    local_8[2] = in_RDI[2];
    local_8[3] = in_RDI[3];
  }
  return local_8;
}

Assistant:

memory_allocator_impl memory_allocator_nginx_create(void *ctx)
{
	memory_allocator_nginx_ctx nginx_ctx = (memory_allocator_nginx_ctx)ctx;

	memory_allocator_nginx_impl nginx_impl = nginx_ctx->palloc(nginx_ctx->pool, sizeof(struct memory_allocator_nginx_impl_type));

	if (nginx_impl == NULL)
	{
		return NULL;
	}

	nginx_impl->pool = nginx_ctx->pool;
	nginx_impl->palloc = nginx_ctx->palloc;
	nginx_impl->pcopy = nginx_ctx->pcopy;
	nginx_impl->pfree = nginx_ctx->pfree;

	return (memory_allocator_impl)nginx_impl;
}